

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-platform.c
# Opt level: O2

int free_region(yescrypt_region_t *region)

{
  int iVar1;
  
  if ((region->base != (void *)0x0) && (iVar1 = munmap(region->base,region->base_size), iVar1 != 0))
  {
    return -1;
  }
  region->base_size = 0;
  region->aligned_size = 0;
  region->base = (void *)0x0;
  region->aligned = (void *)0x0;
  return 0;
}

Assistant:

static int
free_region(yescrypt_region_t * region)
{
	if (region->base) {
#ifdef MAP_ANON
		if (munmap(region->base, region->base_size))
			return -1;
#else
		free(region->base);
#endif
	}
	init_region(region);
	return 0;
}